

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTDMT_waitForAllJobsCompleted(ZSTDMT_CCtx *mtctx)

{
  ZSTDMT_jobDescription *pZVar1;
  uint uVar2;
  
  uVar2 = mtctx->doneJobID;
  while (uVar2 < mtctx->nextJobID) {
    uVar2 = uVar2 & mtctx->jobIDMask;
    pthread_mutex_lock((pthread_mutex_t *)&mtctx->jobs[uVar2].job_mutex);
    while( true ) {
      pZVar1 = mtctx->jobs;
      if (pZVar1[uVar2].src.size <= pZVar1[uVar2].consumed) break;
      pthread_cond_wait((pthread_cond_t *)&pZVar1[uVar2].job_cond,
                        (pthread_mutex_t *)&pZVar1[uVar2].job_mutex);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&pZVar1[uVar2].job_mutex);
    uVar2 = mtctx->doneJobID + 1;
    mtctx->doneJobID = uVar2;
  }
  return;
}

Assistant:

static void ZSTDMT_waitForAllJobsCompleted(ZSTDMT_CCtx* mtctx)
{
    DEBUGLOG(4, "ZSTDMT_waitForAllJobsCompleted");
    while (mtctx->doneJobID < mtctx->nextJobID) {
        unsigned const jobID = mtctx->doneJobID & mtctx->jobIDMask;
        ZSTD_PTHREAD_MUTEX_LOCK(&mtctx->jobs[jobID].job_mutex);
        while (mtctx->jobs[jobID].consumed < mtctx->jobs[jobID].src.size) {
            DEBUGLOG(4, "waiting for jobCompleted signal from job %u", mtctx->doneJobID);   /* we want to block when waiting for data to flush */
            ZSTD_pthread_cond_wait(&mtctx->jobs[jobID].job_cond, &mtctx->jobs[jobID].job_mutex);
        }
        ZSTD_pthread_mutex_unlock(&mtctx->jobs[jobID].job_mutex);
        mtctx->doneJobID++;
    }
}